

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_h_predictor_16x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  long lVar1;
  uint16_t *puVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  
  puVar2 = dst + 8;
  lVar1 = 0;
  do {
    auVar4 = pshuflw(ZEXT216(left[lVar1]),ZEXT216(left[lVar1]),0);
    uVar3 = auVar4._0_4_;
    *(undefined4 *)(puVar2 + -8) = uVar3;
    *(undefined4 *)(puVar2 + -6) = uVar3;
    *(undefined4 *)(puVar2 + -4) = uVar3;
    *(undefined4 *)(puVar2 + -2) = uVar3;
    *(undefined4 *)puVar2 = uVar3;
    *(undefined4 *)(puVar2 + 2) = uVar3;
    *(undefined4 *)(puVar2 + 4) = uVar3;
    *(undefined4 *)(puVar2 + 6) = uVar3;
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + stride;
  } while (lVar1 != 4);
  return;
}

Assistant:

static inline void highbd_h_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)bd;
  for (r = 0; r < bh; r++) {
    aom_memset16(dst, left[r], bw);
    dst += stride;
  }
}